

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_tim_sort_resize(sorter_temp_storage_t *store,size_t new_size)

{
  void *pvVar1;
  ulong in_RSI;
  ulong *in_RDI;
  int64_t *tempstore;
  
  if ((in_RDI[1] == 0) || (*in_RDI < in_RSI)) {
    pvVar1 = realloc((void *)in_RDI[1],in_RSI << 3);
    if (pvVar1 == (void *)0x0) {
      fprintf(_stderr,"Error allocating temporary storage for tim sort: need %lu bytes",in_RSI << 3)
      ;
      exit(1);
    }
    in_RDI[1] = (ulong)pvVar1;
    *in_RDI = in_RSI;
  }
  return;
}

Assistant:

static void TIM_SORT_RESIZE(TEMP_STORAGE_T *store, const size_t new_size) {
  if ((store->storage == NULL) || (store->alloc < new_size)) {
    SORT_TYPE *tempstore =
        (SORT_TYPE *)realloc(store->storage, new_size * sizeof(SORT_TYPE));

    if (tempstore == NULL) {
      fprintf(stderr,
              "Error allocating temporary storage for tim sort: need %lu bytes",
              (unsigned long)(sizeof(SORT_TYPE) * new_size));
      exit(1);
    }

    store->storage = tempstore;
    store->alloc = new_size;
  }
}